

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O1

void __thiscall
MemoryAccountant::createCacheSizeNodes(MemoryAccountant *this,size_t *sizes,size_t length)

{
  int iVar1;
  MemoryAccountantAllocationNode *pMVar2;
  undefined4 extraout_var;
  size_t sVar4;
  MemoryAccountant *pMVar5;
  MemoryAccountantAllocationNode *pMVar3;
  
  if (length != 0) {
    sVar4 = 0;
    do {
      findOrCreateNodeOfSize(this,sizes[sVar4]);
      sVar4 = sVar4 + 1;
    } while (length != sVar4);
  }
  pMVar3 = this->head_;
  pMVar5 = this;
  if (this->head_ != (MemoryAccountantAllocationNode *)0x0) {
    do {
      pMVar2 = pMVar3;
      pMVar3 = pMVar2->next_;
    } while (pMVar3 != (MemoryAccountantAllocationNode *)0x0);
    pMVar5 = (MemoryAccountant *)&pMVar2->next_;
  }
  iVar1 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                    (this->allocator_,0x30,
                     "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O1/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
                     ,0x199);
  pMVar3 = (MemoryAccountantAllocationNode *)CONCAT44(extraout_var,iVar1);
  pMVar3->size_ = 0;
  pMVar3->allocations_ = 0;
  pMVar3->deallocations_ = 0;
  pMVar3->maxAllocations_ = 0;
  pMVar3->currentAllocations_ = 0;
  pMVar3->next_ = (MemoryAccountantAllocationNode *)0x0;
  pMVar5->head_ = pMVar3;
  return;
}

Assistant:

void MemoryAccountant::createCacheSizeNodes(size_t sizes[], size_t length)
{
    for (size_t i = 0; i < length; i++)
        findOrCreateNodeOfSize(sizes[i]);

    if (head_ == NULLPTR)
        head_ = createNewAccountantAllocationNode(0, NULLPTR);
    else {
        for (MemoryAccountantAllocationNode* lastNode = head_; lastNode; lastNode = lastNode->next_) {
            if (lastNode->next_ == NULLPTR) {
                lastNode->next_ = createNewAccountantAllocationNode(0, NULLPTR);
                break;
            }
        }
    }
}